

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O0

void __thiscall Am_Point_List::Set(Am_Point_List *this,float x,float y,bool unique)

{
  bool unique_local;
  float y_local;
  float x_local;
  Am_Point_List *this_local;
  
  if ((this->data != (Am_Point_List_Data *)0x0) && (unique)) {
    Am_Point_List_Data::Make_Unique(this->data,&this->data,&this->item);
  }
  Am_Point_List_Data::Set(this->data,x,y,this->item);
  return;
}

Assistant:

void
Am_Point_List::Set(float x, float y, bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  }
  data->Set(x, y, item);
}